

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O3

void __thiscall
soplex::
SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::sort(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  fpclass_type fVar16;
  int32_t iVar17;
  long lVar18;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *s;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar19;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar20;
  long lVar21;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar22;
  long lVar23;
  
  pNVar7 = this->m_elem;
  if ((pNVar7 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0) && (iVar4 = this->memused, 1 < (long)iVar4)) {
    pNVar19 = pNVar7 + 1;
    lVar21 = 0;
    pNVar22 = pNVar7;
    do {
      iVar5 = pNVar22[1].idx;
      if (iVar5 < pNVar22->idx) {
        uVar8 = *(undefined8 *)((pNVar19->val).m_backend.data._M_elems + 8);
        uVar9 = *(undefined8 *)(pNVar19->val).m_backend.data._M_elems;
        uVar10 = *(undefined8 *)((pNVar19->val).m_backend.data._M_elems + 2);
        uVar11 = *(undefined8 *)((pNVar19->val).m_backend.data._M_elems + 4);
        uVar12 = *(undefined8 *)((pNVar19->val).m_backend.data._M_elems + 6);
        iVar6 = pNVar22[1].val.m_backend.exp;
        bVar3 = pNVar22[1].val.m_backend.neg;
        fVar16 = pNVar22[1].val.m_backend.fpclass;
        iVar17 = pNVar22[1].val.m_backend.prec_elem;
        lVar18 = 0;
        do {
          lVar23 = lVar18;
          *(undefined8 *)((long)pNVar22[1].val.m_backend.data._M_elems + lVar23 + 0x20) =
               *(undefined8 *)((long)(pNVar22->val).m_backend.data._M_elems + lVar23 + 0x20);
          puVar1 = (undefined8 *)((long)(pNVar22->val).m_backend.data._M_elems + lVar23);
          uVar13 = *puVar1;
          uVar14 = puVar1[1];
          puVar1 = (undefined8 *)((long)(pNVar22->val).m_backend.data._M_elems + lVar23 + 0x10);
          uVar15 = puVar1[1];
          puVar2 = (undefined8 *)((long)pNVar22[1].val.m_backend.data._M_elems + lVar23 + 0x10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar15;
          puVar1 = (undefined8 *)((long)pNVar22[1].val.m_backend.data._M_elems + lVar23);
          *puVar1 = uVar13;
          puVar1[1] = uVar14;
          *(undefined4 *)((long)(&pNVar22[1].val.m_backend.data + 1) + lVar23) =
               *(undefined4 *)((long)(&(pNVar22->val).m_backend.data + 1) + lVar23);
          *(undefined1 *)((long)(&pNVar22[1].val.m_backend.data + 1) + lVar23 + 4) =
               *(undefined1 *)((long)(&(pNVar22->val).m_backend.data + 1) + lVar23 + 4);
          *(undefined8 *)((long)(&pNVar22[1].val.m_backend.data + 1) + lVar23 + 8) =
               *(undefined8 *)((long)(&(pNVar22->val).m_backend.data + 1) + lVar23 + 8);
          *(undefined4 *)((long)(&pNVar22[1].val + 1) + lVar23) =
               *(undefined4 *)((long)(&pNVar22->val + 1) + lVar23);
          pNVar20 = pNVar7;
          if (lVar21 == lVar23) goto LAB_002f3ee5;
          lVar18 = lVar23 + -0x3c;
        } while (iVar5 < *(int *)((long)(pNVar22->val).m_backend.data._M_elems + lVar23 + -4));
        pNVar20 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar19[-1].val.m_backend.data._M_elems + lVar23);
LAB_002f3ee5:
        *(undefined8 *)((pNVar20->val).m_backend.data._M_elems + 8) = uVar8;
        *(undefined8 *)((pNVar20->val).m_backend.data._M_elems + 4) = uVar11;
        *(undefined8 *)((pNVar20->val).m_backend.data._M_elems + 6) = uVar12;
        *(undefined8 *)(pNVar20->val).m_backend.data._M_elems = uVar9;
        *(undefined8 *)((pNVar20->val).m_backend.data._M_elems + 2) = uVar10;
        (pNVar20->val).m_backend.exp = iVar6;
        (pNVar20->val).m_backend.neg = bVar3;
        (pNVar20->val).m_backend.fpclass = fVar16;
        (pNVar20->val).m_backend.prec_elem = iVar17;
        pNVar20->idx = iVar5;
      }
      pNVar19 = pNVar19 + 1;
      pNVar22 = pNVar22 + 1;
      lVar21 = lVar21 + -0x3c;
    } while (pNVar19 < pNVar7 + iVar4);
  }
  return;
}

Assistant:

void sort()
   {
      if(m_elem != nullptr)
      {
         Nonzero<R> dummy;
         Nonzero<R>* w;
         Nonzero<R>* l;
         Nonzero<R>* s = &(m_elem[0]);
         Nonzero<R>* e = s + size();

         for(l = s, w = s + 1; w < e; l = w, ++w)
         {
            if(l->idx > w->idx)
            {
               dummy = *w;

               do
               {
                  l[1] = *l;

                  if(l-- == s)
                     break;
               }
               while(l->idx > dummy.idx);

               l[1] = dummy;
            }
         }
      }
   }